

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

void __thiscall
flatbuffers::anon_unknown_26::RustCodeGenerator::~RustCodeGenerator(RustCodeGenerator *this)

{
  CodeGenerator::~CodeGenerator(&this->super_CodeGenerator);
  operator_delete(this,0x28);
  return;
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    if (!GenerateRust(parser, path, filename)) { return Status::ERROR; }
    return Status::OK;
  }